

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O2

void printBits(char *c,float f)

{
  int i;
  uint uVar1;
  int iVar2;
  
  iVar2 = 0;
  for (uVar1 = 0x1f; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    c[iVar2] = ((uint)f >> (uVar1 & 0x1f) & 1) == 0 ^ 0x31;
    if ((uVar1 & 0x7ffffff7) == 0x17) {
      c[(long)iVar2 + 1] = ' ';
      iVar2 = iVar2 + 1;
    }
    iVar2 = iVar2 + 1;
  }
  c[0x22] = '\0';
  return;
}

Assistant:

HALF_EXPORT void
printBits (char c[35], float f)
{
    half::uif x;
    x.f = f;

    for (int i = 31, j = 0; i >= 0; i--, j++)
    {
	c[j] = (((x.i >> i) & 1)? '1': '0');

	if (i == 31 || i == 23)
	    c[++j] = ' ';
    }

    c[34] = 0;
}